

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

string * __thiscall
wabt::LoadStoreTracking::GenAccess_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,uint64_t offset,Node *addr_exp)

{
  bool bVar1;
  Enum EVar2;
  ulong uVar3;
  pointer ppVar4;
  pointer ppVar5;
  allocator local_7a;
  allocator local_79;
  _Self local_78;
  _Self local_70;
  const_iterator ait;
  _Self local_60;
  _Self local_58;
  const_iterator it;
  undefined1 local_48 [8];
  string name;
  Node *addr_exp_local;
  uint64_t offset_local;
  LoadStoreTracking *this_local;
  
  name.field_2._8_8_ = addr_exp;
  addr_exp_local = (Node *)offset;
  offset_local = (uint64_t)this;
  this_local = (LoadStoreTracking *)__return_storage_ptr__;
  AddrExpName_abi_cxx11_((string *)local_48,this,addr_exp);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
         ::find(&this->vars,(key_type *)local_48);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
         ::end(&this->vars);
    bVar1 = std::operator==(&local_58,&local_60);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"",(allocator *)((long)&ait._M_node + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&ait._M_node + 7));
    }
    else {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
               ::operator->(&local_58);
      if (((ppVar4->second).struct_layout & 1U) == 0) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
                 ::operator->(&local_58);
        EVar2 = Type::operator_cast_to_Enum(&(ppVar4->second).same_type);
        if (EVar2 == Void) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_7a);
          std::allocator<char>::~allocator((allocator<char> *)&local_7a);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"*",&local_79);
          std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
      }
      else {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
                 ::operator->(&local_58);
        local_70._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::find(&(ppVar4->second).accesses,(key_type *)&addr_exp_local);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>
                 ::operator->(&local_58);
        local_78._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::end(&(ppVar4->second).accesses);
        bVar1 = std::operator!=(&local_70,&local_78);
        if (!bVar1) {
          __assert_fail("ait != it->second.accesses.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler-ls.h"
                        ,0xf8,
                        "std::string wabt::LoadStoreTracking::GenAccess(uint64_t, const Node &) const"
                       );
        }
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>
                 ::operator->(&local_70);
        IdxToName_abi_cxx11_(__return_storage_ptr__,this,(ppVar5->second).idx);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",(allocator *)((long)&it._M_node + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  }
  it._M_node._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GenAccess(uint64_t offset, const Node& addr_exp) const {
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return "";
    }
    auto it = vars.find(name);
    if (it == vars.end()) {
      return "";
    }
    if (it->second.struct_layout) {
      auto ait = it->second.accesses.find(offset);
      assert (ait != it->second.accesses.end());
      return IdxToName(ait->second.idx);
    }
    // Not a struct, see if it is a typed pointer.
    if (it->second.same_type != Type::Void) {
      return "*";
    }
    return "";
  }